

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O3

int64_t fiobj_ary_find(FIOBJ ary,FIOBJ data)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t iVar5;
  
  if ((((ary == 0) || ((~(uint)ary & 6) == 0)) || ((ary & 1) != 0)) ||
     (*(char *)(ary & 0xfffffffffffffff8) != ')')) {
    __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                  ,0xcb,"int64_t fiobj_ary_find(FIOBJ, FIOBJ)");
  }
  uVar1 = *(ulong *)(ary + 8);
  uVar2 = *(ulong *)(ary + 0x10);
  iVar5 = -1;
  if (uVar2 != uVar1) {
    uVar4 = uVar1;
    if (uVar1 < uVar2) {
      uVar3 = uVar1;
      do {
        uVar4 = uVar3;
        if (*(FIOBJ *)(*(long *)(ary + 0x20) + uVar3 * 8) == data) break;
        uVar3 = uVar3 + 1;
        uVar4 = uVar2;
      } while (uVar2 != uVar3);
    }
    iVar5 = -1;
    if (uVar4 != uVar2) {
      iVar5 = uVar4 - uVar1;
    }
  }
  return iVar5;
}

Assistant:

int64_t fiobj_ary_find(FIOBJ ary, FIOBJ data) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  return (int64_t)fio_ary___find(&obj2ary(ary)->ary, data);
}